

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O0

WaitCompletionState __thiscall
CorUnix::CSynchData::IsRestOfWaitAllSatisfied(CSynchData *this,WaitingThreadsListNode *pwtlnNode)

{
  ObjectDomain OVar1;
  bool local_42;
  undefined1 local_41;
  bool fIsAbandoned;
  WaitingThreadsListNode *pWStack_40;
  bool fRetVal;
  WaitingThreadsListNode *pwtlnItem;
  ThreadWaitInfo *ptwiWaitInfo;
  CSynchData *psdSynchDataItem;
  WaitCompletionState wcsWaitCompletionState;
  int i;
  int iTgtCount;
  int iSignaledOrOwnedObjCount;
  WaitingThreadsListNode *pwtlnNode_local;
  CSynchData *this_local;
  
  i = 0;
  wcsWaitCompletionState = WaitIsNotSatisfied;
  psdSynchDataItem._0_4_ = 0;
  ptwiWaitInfo = (ThreadWaitInfo *)0x0;
  pwtlnItem = (WaitingThreadsListNode *)0x0;
  _iTgtCount = pwtlnNode;
  pwtlnNode_local = (WaitingThreadsListNode *)this;
  if ((pwtlnNode->dwFlags & 2) == 0) {
    fprintf(_stderr,"] %s %s:%d","IsRestOfWaitAllSatisfied",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x626);
    fprintf(_stderr,
            "Expression: 0 != (WTLN_FLAG_WAIT_ALL & pwtlnNode->dwFlags), Description: IsRestOfWaitAllSatisfied() called on a normal (non wait all) wait"
           );
  }
  OVar1 = GetObjectDomain(this);
  if ((OVar1 == SharedObject) != ((_iTgtCount->dwFlags & 1) != 0)) {
    fprintf(_stderr,"] %s %s:%d","IsRestOfWaitAllSatisfied",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x62a);
    fprintf(_stderr,
            "Expression: (SharedObject == GetObjectDomain()) == (0 != (WTLN_FLAG_OWNER_OBJECT_IS_SHARED & pwtlnNode->dwFlags)), Description: WTLN_FLAG_OWNER_OBJECT_IS_SHARED in WaitingThreadsListNode not consistent with target object\'s domain\n"
           );
  }
  if (gPID == _iTgtCount->dwProcessId) {
    pwtlnItem = (WaitingThreadsListNode *)_iTgtCount->ptwiWaitInfo;
    wcsWaitCompletionState = ((_ThreadWaitInfo *)pwtlnItem)->lObjCount;
    for (psdSynchDataItem._4_4_ = 0; psdSynchDataItem._4_4_ < (int)wcsWaitCompletionState;
        psdSynchDataItem._4_4_ = psdSynchDataItem._4_4_ + 1) {
      pWStack_40 = *(WaitingThreadsListNode **)
                    (&pwtlnItem->dwThreadId + (long)psdSynchDataItem._4_4_ * 2);
      if ((pWStack_40->dwFlags & 1) == 0) {
        ptwiWaitInfo = (ThreadWaitInfo *)(pWStack_40->ptrOwnerObjSynchData).ptr;
      }
      else {
        ptwiWaitInfo = (ThreadWaitInfo *)SHMPtrToPtr((pWStack_40->ptrOwnerObjSynchData).shrid);
      }
      if (pWStack_40 == _iTgtCount) {
        if ((ThreadWaitInfo *)this != ptwiWaitInfo) {
          fprintf(_stderr,"] %s %s:%d","IsRestOfWaitAllSatisfied",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                  ,0x65b);
          fprintf(_stderr,
                  "Expression: this == psdSynchDataItem, Description: pwtlnNode and pwtlnItem match, but this and psdSynchDataItem don\'t\n"
                 );
        }
      }
      else {
        local_41 = CanWaiterWaitWithoutBlocking
                             ((CSynchData *)ptwiWaitInfo,(CPalThread *)pwtlnItem->shridSHRThis,
                              &local_42);
        if (!(bool)local_41) break;
      }
      i = i + 1;
    }
    psdSynchDataItem._0_4_ = (WaitCompletionState)((int)wcsWaitCompletionState <= i);
  }
  else {
    psdSynchDataItem._0_4_ = WaitMayBeSatisfied;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (WaitCompletionState)psdSynchDataItem;
}

Assistant:

WaitCompletionState CSynchData::IsRestOfWaitAllSatisfied(
        WaitingThreadsListNode * pwtlnNode)
    {
        int iSignaledOrOwnedObjCount = 0; 
        int iTgtCount = 0;
        int i;
        WaitCompletionState wcsWaitCompletionState = WaitIsNotSatisfied;
        CSynchData * psdSynchDataItem = NULL;
        ThreadWaitInfo * ptwiWaitInfo = NULL;

        VALIDATEOBJECT(this);
        VALIDATEOBJECT(pwtlnNode);

        _ASSERT_MSG(0 != (WTLN_FLAG_WAIT_ALL & pwtlnNode->dwFlags),
                    "IsRestOfWaitAllSatisfied() called on a normal "
                    "(non wait all) wait");
        _ASSERT_MSG((SharedObject == GetObjectDomain()) == 
                    (0 != (WTLN_FLAG_OWNER_OBJECT_IS_SHARED & pwtlnNode->dwFlags)),
                    "WTLN_FLAG_OWNER_OBJECT_IS_SHARED in WaitingThreadsListNode "
                    "not consistent with target object's domain\n");

        if(gPID != pwtlnNode->dwProcessId)
        {
            ////////////////////////////
            //
            // Remote Thread Awakening 
            //
            ////////////////////////////
            
            // Cannot determine whether or not the wait all is satisfied from 
            // this process 
            wcsWaitCompletionState = WaitMayBeSatisfied;
            goto IROWAS_exit;            
        }

        ///////////////////////////
        //
        // Local Thread Awakening
        //
        ///////////////////////////
        
        ptwiWaitInfo = pwtlnNode->ptwiWaitInfo;

        iTgtCount = ptwiWaitInfo->lObjCount;
        for (i=0; i < iTgtCount; i++)
        {
            WaitingThreadsListNode * pwtlnItem = ptwiWaitInfo->rgpWTLNodes[i];
            bool fRetVal;
            bool fIsAbandoned;

            VALIDATEOBJECT(pwtlnItem);

            if (0 != (WTLN_FLAG_OWNER_OBJECT_IS_SHARED & pwtlnItem->dwFlags))
            {                
                psdSynchDataItem = SharedIDToTypePointer(CSynchData, 
                    pwtlnItem->ptrOwnerObjSynchData.shrid);
            }
            else
            {
                psdSynchDataItem = pwtlnItem->ptrOwnerObjSynchData.ptr;
            }

            VALIDATEOBJECT(psdSynchDataItem);

            if (pwtlnItem == pwtlnNode)
            {
                _ASSERT_MSG (this == psdSynchDataItem,
                             "pwtlnNode and pwtlnItem match, but this "
                             "and psdSynchDataItem don't\n");

                // The target object (the one related to pwtlnNode) is counted as
                // signaled/owned without checking it (also if it is not, as 
                // it normally happens when this method is called)                
                iSignaledOrOwnedObjCount++;                
                continue;
            }

            fRetVal = psdSynchDataItem->CanWaiterWaitWithoutBlocking(
                ptwiWaitInfo->pthrOwner,
                &fIsAbandoned);

            if (fRetVal)
            {
                iSignaledOrOwnedObjCount++;
            }
            else
            {
                break;
            }                
        }

        if (iSignaledOrOwnedObjCount < iTgtCount)
        {
            wcsWaitCompletionState = WaitIsNotSatisfied;
        }
        else
        {
            wcsWaitCompletionState = WaitIsSatisfied;
        }

    IROWAS_exit:        
        TRACE("IsRestOfWaitAllSatisfied() returning %u \n", wcsWaitCompletionState);
        
        return wcsWaitCompletionState;
    }